

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

void * lua_touserdata(lua_State *L,int idx)

{
  ulong uVar1;
  TValue *pTVar2;
  void *pvVar3;
  
  pTVar2 = index2adr(L,idx);
  uVar1 = pTVar2->u64;
  if ((long)uVar1 >> 0x2f == -4) {
    pvVar3 = (void *)(uVar1 & 0x7fffffffff |
                     (ulong)*(uint *)(*(long *)((L->glref).ptr64 + 0x70) +
                                     (uVar1 >> 0x27 & 0xff) * 4) << 0x20);
  }
  else if ((long)uVar1 >> 0x2f == -0xd) {
    pvVar3 = (void *)((uVar1 & 0x7fffffffffff) + 0x30);
  }
  else {
    pvVar3 = (void *)0x0;
  }
  return pvVar3;
}

Assistant:

LUA_API void *lua_touserdata(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  if (tvisudata(o))
    return uddata(udataV(o));
  else if (tvislightud(o))
    return lightudV(G(L), o);
  else
    return NULL;
}